

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3_stricmp(char *zLeft,char *zRight)

{
  char *in_RSI;
  char *in_RDI;
  undefined4 local_4;
  
  if (in_RDI == (char *)0x0) {
    local_4 = 0;
    if (in_RSI != (char *)0x0) {
      local_4 = -1;
    }
  }
  else if (in_RSI == (char *)0x0) {
    local_4 = 1;
  }
  else {
    local_4 = sqlite3StrICmp(in_RDI,in_RSI);
  }
  return local_4;
}

Assistant:

SQLITE_API int sqlite3_stricmp(const char *zLeft, const char *zRight){
  if( zLeft==0 ){
    return zRight ? -1 : 0;
  }else if( zRight==0 ){
    return 1;
  }
  return sqlite3StrICmp(zLeft, zRight);
}